

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5c268::MapDrivePlugIn::redraw
          (MapDrivePlugIn *this,float currentTime,float elapsedTime)

{
  size_type segmentIndex;
  Color CVar1;
  MapDrivePlugIn *pMVar2;
  float fVar3;
  bool bVar4;
  TerrainMap *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ostringstream *status_00;
  ostringstream *status_01;
  ostringstream *status_02;
  ostringstream *status_03;
  Color *color_00;
  long lVar10;
  char *pcVar11;
  Color *in_R9;
  int iVar12;
  ulong uVar13;
  MapDriver *pMVar14;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Vec3 location;
  Color pathColor;
  Color sandColor;
  Color color;
  ostringstream status;
  Color local_298;
  Color local_288;
  float local_278;
  float fStack_274;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_24c;
  Color local_248;
  Vec3 local_238;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_200;
  float local_1fc;
  undefined1 local_1f8 [16];
  MapDrivePlugIn *local_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  Vec3 local_1c8;
  Vec3 local_1b8;
  Color local_1a8 [7];
  ios_base local_138 [264];
  
  local_248.a_ = local_248.g_;
  OpenSteer::OpenSteerDemo::updateCamera(currentTime,elapsedTime,(AbstractVehicle *)this->vehicle);
  local_248.b_ = 400.0;
  local_248.r_ = 400.0;
  local_248.g_ = -0.2;
  local_298.r_ = 400.0;
  local_298.g_ = -0.2;
  local_298.b_ = -400.0;
  local_288.r_ = -400.0;
  local_288.g_ = -0.2;
  local_288.b_ = -400.0;
  local_238.x = -400.0;
  local_238.y = -0.2;
  local_238.z = 400.0;
  fVar19 = 0.7;
  OpenSteer::Color::Color(local_1a8,0.8,0.7,0.5,1.0);
  OpenSteer::drawQuadrangle
            ((OpenSteer *)&local_248,(Vec3 *)&local_298,(Vec3 *)&local_288,&local_238,
             (Vec3 *)local_1a8,in_R9);
  pMVar14 = this->vehicle;
  pTVar5 = pMVar14->map;
  iVar7 = pTVar5->resolution;
  local_1e0 = this;
  if (0 < iVar7) {
    local_1fc = pTVar5->xSize;
    fVar18 = local_1fc / (float)iVar7;
    local_200 = pTVar5->zSize / (float)iVar7;
    fVar19 = (pTVar5->center).x - (local_1fc - fVar18) * 0.5;
    fVar20 = (pTVar5->center).y;
    fVar16 = (pTVar5->center).z - (pTVar5->zSize - local_200) * 0.5;
    local_218._0_4_ = fVar18;
    local_24c = local_200 * 0.5;
    local_1f8 = ZEXT416((uint)(fVar18 * 0.5));
    _local_1d8 = ZEXT416((uint)(fVar18 * 0.5));
    iVar12 = 0;
    fVar18 = 0.0;
    do {
      fVar20 = fVar20 + 0.0;
      if (0 < iVar7) {
        lVar10 = 0;
        fVar17 = fVar18;
        do {
          iVar7 = iVar7 * iVar12;
          iVar9 = iVar7 + (int)lVar10;
          iVar8 = iVar7 + (int)lVar10 + 0x3f;
          if (-1 < iVar9) {
            iVar8 = iVar9;
          }
          if (((pTVar5->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar8 >> 6) +
                (ulong)((iVar7 + lVar10 & 0x800000000000003fU) < 0x8000000000000001) +
                0xffffffffffffffff] >> (iVar7 + lVar10 & 0x3fU) & 1) == 0) {
            fVar18 = fVar20;
            fVar3 = fVar20 + 0.0;
            fVar17 = fVar20;
          }
          else {
            local_278 = fVar16;
            local_268 = fVar19;
            fStack_264 = fVar20;
            fStack_260 = fVar18;
            fStack_25c = fVar17;
            OpenSteer::Color::Color(local_1a8,0.5,0.2,0.0,1.0);
            CVar1 = local_248;
            local_298.r_ = (float)local_1d8._0_4_ + local_268;
            local_298.g_ = (float)local_1d8._4_4_ + fStack_264;
            fStack_220 = fStack_1d0 + fStack_260;
            fStack_21c = fStack_1cc + fStack_25c;
            local_238.z = local_24c + local_278;
            local_248.g_ = local_298.g_;
            local_248.r_ = local_298.r_;
            local_248.a_ = CVar1.a_;
            local_248.b_ = local_238.z;
            local_298.b_ = local_278 - local_24c;
            local_288.r_ = local_268 - (float)local_1f8._0_4_;
            local_238.y = local_298.g_;
            local_238.x = local_288.r_;
            local_288.g_ = local_298.g_;
            local_288.b_ = local_298.b_;
            local_228 = local_298.r_;
            fStack_224 = local_298.g_;
            OpenSteer::drawQuadrangle
                      ((OpenSteer *)&local_248,(Vec3 *)&local_298,(Vec3 *)&local_288,&local_238,
                       (Vec3 *)local_1a8,in_R9);
            pTVar5 = pMVar14->map;
            fVar19 = local_268;
            fVar18 = fStack_264;
            fVar16 = local_278;
            fVar3 = fStack_224;
            fVar17 = fStack_224;
          }
          fVar20 = fVar3;
          fVar19 = fVar19 + (float)local_218._0_4_;
          fVar16 = fVar16 + 0.0;
          iVar7 = pTVar5->resolution;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < iVar7);
        iVar7 = pTVar5->resolution;
      }
      fVar19 = fVar19 - local_1fc;
      fVar16 = fVar16 + local_200;
      iVar12 = iVar12 + 1;
      fVar18 = fVar20;
    } while (iVar12 < iVar7);
    pMVar14 = local_1e0->vehicle;
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    OpenSteer::Color::Color(&local_298,0.0,0.5,0.5,1.0);
    OpenSteer::Color::Color(&local_288,0.8,0.7,0.5,1.0);
    local_248 = OpenSteer::operator-(&local_298,&local_288);
    local_1a8[0] = OpenSteer::operator*(&local_248,0.1);
    local_1a8[0] = OpenSteer::operator+(&local_288,local_1a8);
    uVar15 = local_1a8[0]._8_8_;
    iVar7 = (*(pMVar14->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])();
    fVar19 = (float)uVar15;
    if (1 < CONCAT44(extraout_var,iVar7)) {
      uVar13 = 1;
      do {
        fVar19 = (float)uVar15;
        (*(pMVar14->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                  (pMVar14->path,uVar13);
        CVar1 = local_248;
        fVar19 = fVar19 + 0.0;
        local_248.g_ = extraout_XMM0_Db + -0.1;
        local_248.r_ = extraout_XMM0_Da + 0.0;
        local_248.a_ = CVar1.a_;
        local_248.b_ = fVar19;
        segmentIndex = uVar13 - 1;
        (*(pMVar14->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                  (pMVar14->path,segmentIndex);
        local_238.z = fVar19 + 0.0;
        uVar15 = (ulong)(uint)local_238.z;
        local_238.y = extraout_XMM0_Db_00 + -0.1;
        local_238.x = extraout_XMM0_Da_00 + 0.0;
        local_278 = OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius
                              (pMVar14->path,segmentIndex);
        OpenSteer::drawXZWideLine((Vec3 *)&local_248,&local_238,local_1a8,local_278 + local_278);
        (*(pMVar14->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                  (pMVar14->path,uVar13);
        local_1b8.z = (float)uVar15;
        (*(pMVar14->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                  (pMVar14->path,segmentIndex);
        local_1c8.z = (float)uVar15;
        OpenSteer::drawLine(&local_1b8,&local_1c8,&local_298);
        if (OpenSteer::updatePhaseActive == '\x01') {
          OpenSteer::warnIfInUpdatePhase2("drawXZDisk");
        }
        OpenSteer::drawXZCircleOrDisk(local_278,(Vec3 *)&local_248,local_1a8,0x18,true);
        if (OpenSteer::updatePhaseActive == '\x01') {
          OpenSteer::warnIfInUpdatePhase2("drawXZDisk");
        }
        OpenSteer::drawXZCircleOrDisk(local_278,&local_238,local_1a8,0x18,true);
        iVar7 = (*(pMVar14->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])();
        fVar19 = (float)uVar15;
        uVar13 = uVar13 + 1;
      } while (uVar13 < CONCAT44(extraout_var_00,iVar7));
    }
    pMVar14 = local_1e0->vehicle;
  }
  pMVar2 = local_1e0;
  local_1a8[0].b_ = (float)OpenSteer::gBlack._8_4_;
  local_1a8[0].a_ = (float)OpenSteer::gBlack._12_4_;
  local_1a8[0].r_ = (float)OpenSteer::gBlack._0_4_;
  local_1a8[0].g_ = (float)OpenSteer::gBlack._4_4_;
  if (pMVar14->stuck == true) {
    local_1a8[0].b_ = (float)OpenSteer::gYellow._8_4_;
    local_1a8[0].a_ = (float)OpenSteer::gYellow._12_4_;
    local_1a8[0].r_ = (float)OpenSteer::gYellow._0_4_;
    local_1a8[0].g_ = (float)OpenSteer::gYellow._4_4_;
  }
  bVar4 = MapDriver::bodyInsidePath(pMVar14);
  if (!bVar4) {
    local_1a8[0].g_ = (float)OpenSteer::gOrange._4_4_;
    local_1a8[0].r_ = (float)OpenSteer::gOrange._0_4_;
    local_1a8[0].b_ = (float)OpenSteer::gOrange._8_4_;
    local_1a8[0].a_ = (float)OpenSteer::gOrange._12_4_;
  }
  if (pMVar14->collisionDetected == true) {
    local_1a8[0].g_ = (float)OpenSteer::gRed._4_4_;
    local_1a8[0].r_ = (float)OpenSteer::gRed._0_4_;
    local_1a8[0].b_ = (float)OpenSteer::gRed._8_4_;
    local_1a8[0].a_ = (float)OpenSteer::gRed._12_4_;
  }
  (*(pMVar14->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(pMVar14);
  local_228 = fVar19;
  local_278 = extraout_XMM0_Da_01;
  fStack_274 = extraout_XMM0_Db_01;
  fVar20 = local_228;
  (*(pMVar14->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[2])(pMVar14);
  local_218 = ZEXT416((uint)pMVar14->halfWidth);
  fVar20 = fVar20 * pMVar14->halfWidth;
  local_1f8._0_4_ = fVar20;
  local_268 = extraout_XMM0_Da_02;
  fStack_264 = extraout_XMM0_Db_02;
  (*(pMVar14->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[6])(pMVar14);
  CVar1 = local_248;
  fVar19 = pMVar14->halfLength;
  fVar17 = local_228 - fVar20 * fVar19;
  local_268 = (float)local_218._0_4_ * local_268;
  fStack_264 = (float)local_218._0_4_ * fStack_264;
  fVar18 = local_278 - fVar19 * extraout_XMM0_Da_03;
  fVar16 = fStack_274 - fVar19 * extraout_XMM0_Db_03;
  local_248.g_ = fStack_264 + fVar16 + 0.1;
  local_248.r_ = local_268 + fVar18 + 0.0;
  local_248.a_ = CVar1.a_;
  local_248.b_ = (float)local_1f8._0_4_ + fVar17 + 0.0;
  fVar20 = fVar20 * fVar19 + local_228;
  local_278 = fVar19 * extraout_XMM0_Da_03 + local_278;
  fStack_274 = fVar19 * extraout_XMM0_Db_03 + fStack_274;
  local_298.r_ = local_268 + local_278 + 0.0;
  local_298.g_ = fStack_264 + fStack_274 + 0.1;
  local_298.b_ = (float)local_1f8._0_4_ + fVar20 + 0.0;
  local_288.r_ = (local_278 - local_268) + 0.0;
  local_288.g_ = (fStack_274 - fStack_264) + 0.1;
  local_288.b_ = (fVar20 - (float)local_1f8._0_4_) + 0.0;
  local_238.z = (fVar17 - (float)local_1f8._0_4_) + 0.0;
  local_238.y = (fVar16 - fStack_264) + 0.1;
  local_238.x = (fVar18 - local_268) + 0.0;
  OpenSteer::drawQuadrangle
            ((OpenSteer *)&local_248,(Vec3 *)&local_298,(Vec3 *)&local_288,&local_238,
             (Vec3 *)local_1a8,in_R9);
  OpenSteer::Color::Color(&local_248,0.0,0.6,0.0,1.0);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::drawTrail
            ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)pMVar14,
             &local_248,(Color *)OpenSteer::gBlack);
  local_1a8[0]._0_12_ = ZEXT812(0x40000000);
  local_248._0_12_ = ZEXT812(0xc0000000);
  OpenSteer::drawLine((Vec3 *)local_1a8,(Vec3 *)&local_248,(Color *)OpenSteer::gGreen);
  local_1a8[0]._0_12_ = ZEXT412(0x40000000) << 0x40;
  local_248._0_12_ = ZEXT412(0xc0000000) << 0x40;
  OpenSteer::drawLine((Vec3 *)local_1a8,(Vec3 *)&local_248,(Color *)OpenSteer::gGreen);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Speed: ",7);
  (*(pMVar2->vehicle->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])();
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)extraout_XMM0_Da_04);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," mps (",6);
  (*(pMVar2->vehicle->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])();
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)poVar6,(int)(extraout_XMM0_Da_05 / 0.44704));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," mph)",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", average: ",0xb);
  lVar10 = *(long *)poVar6;
  *(undefined8 *)(poVar6 + *(long *)(lVar10 + -0x18) + 8) = 1;
  *(uint *)(poVar6 + *(long *)(lVar10 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(lVar10 + -0x18) + 0x18) | 4;
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(pMVar2->vehicle->totalDistance / pMVar2->vehicle->totalTime));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," mps\n\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"collisions avoided for ",0x17);
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_1a8,
                      (int)(OpenSteer::OpenSteerDemo::clock.totalSimulationTime -
                           pMVar2->vehicle->timeOfLastCollision));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," seconds",8);
  if (0 < pMVar2->vehicle->countOfCollisionFreeTimes) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nmean time between collisions: ",0x1f);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)local_1a8,
                        (int)(pMVar2->vehicle->sumOfCollisionFreeTimes /
                             (float)pMVar2->vehicle->countOfCollisionFreeTimes));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar6,(int)pMVar2->vehicle->sumOfCollisionFreeTimes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)poVar6,pMVar2->vehicle->countOfCollisionFreeTimes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\nStuck count: ",0xf);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,pMVar2->vehicle->stuckCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,pMVar2->vehicle->stuckCycleCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," cycles, ",9);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,pMVar2->vehicle->stuckOffPathCount)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," off path)",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\n[F1] ",7);
  if ((anonymous_namespace)::MapDriver::demoSelect == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"wander, ",8);
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"follow path, ",0xd);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"avoid obstacle",0xe);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n[F2] path following direction: ",0x20);
    pcVar11 = "-1";
    if (0 < pMVar2->vehicle->pathFollowDirection) {
      pcVar11 = "+1";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n[F3] path fence: ",0x12);
    pcVar11 = "off";
    if ((ulong)pMVar2->usePathFences != 0) {
      pcVar11 = "on";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar11,(ulong)pMVar2->usePathFences ^ 3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n[F4] rocks: ",0xd);
  pcVar11 = "off";
  if ((ulong)pMVar2->useRandomRocks != 0) {
    pcVar11 = "on";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar11,(ulong)pMVar2->useRandomRocks ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n[F5] prediction: ",0x12);
  pcVar11 = "linear";
  if (pMVar2->vehicle->curvedSteering != false) {
    pcVar11 = "curved";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,6);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\nLap ",6);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,pMVar2->vehicle->lapsStarted);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (completed: ",0xd);
    iVar7 = pMVar2->vehicle->lapsStarted;
    iVar12 = 0;
    if (1 < iVar7) {
      iVar12 = (int)(((float)pMVar2->vehicle->lapsFinished / (float)(iVar7 + -1)) * 100.0);
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"%)",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nHints given: ",0xe);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)local_1a8,pMVar2->vehicle->hintGivenCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", taken: ",9);
    std::ostream::operator<<((ostream *)poVar6,pMVar2->vehicle->hintTakenCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  qqqRange((MapDrivePlugIn *)"WR ",(char *)local_1a8,
           (anonymous_namespace)::MapDriver::savedNearestWR,status_00);
  qqqRange((MapDrivePlugIn *)"R  ",(char *)local_1a8,(anonymous_namespace)::MapDriver::savedNearestR
           ,status_01);
  qqqRange((MapDrivePlugIn *)"L  ",(char *)local_1a8,(anonymous_namespace)::MapDriver::savedNearestL
           ,status_02);
  qqqRange((MapDrivePlugIn *)"WL ",(char *)local_1a8,
           (anonymous_namespace)::MapDriver::savedNearestWL,status_03);
  std::ostream::put((char)local_1a8);
  local_278 = OpenSteer::drawGetWindowHeight();
  OpenSteer::Color::Color(&local_248,0.15,0.15,0.5,1.0);
  local_268 = OpenSteer::drawGetWindowWidth();
  fVar19 = OpenSteer::drawGetWindowHeight();
  location.y = local_278 + -50.0;
  location.x = 10.0;
  location.z = 0.0;
  OpenSteer::draw2dTextAt2dLocation
            ((OpenSteer *)local_1a8,(ostringstream *)&local_248,location,color_00,local_268,fVar19);
  local_278 = OpenSteer::drawGetWindowWidth();
  pMVar14 = pMVar2->vehicle;
  (*(pMVar14->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])(pMVar14);
  local_1f8._0_4_ = extraout_XMM0_Da_06;
  (*(pMVar14->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(pMVar14);
  local_268 = local_278 + -20.0;
  fVar19 = pMVar2->vehicle->annoteMaxRelSpeed;
  local_298.r_ = local_268 * fVar19 + 10.0;
  local_298.g_ = 2.0;
  local_298.b_ = 0.0;
  local_288.g_ = 8.0;
  local_288.b_ = 0.0;
  local_288.r_ = local_298.r_;
  local_24c = extraout_XMM0_Da_07;
  local_218._0_4_ = fVar19;
  local_228 = OpenSteer::drawGetWindowWidth();
  fVar19 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_298,(Vec3 *)&local_288,(Color *)OpenSteer::gBlack,local_228,fVar19);
  if (((float)local_218._0_4_ != 0.0) || (NAN((float)local_218._0_4_))) {
    local_298.r_ = pMVar2->vehicle->annoteMaxRelSpeedCurve * local_268 + 10.0;
    local_218._0_4_ = pMVar2->vehicle->annoteMaxRelSpeedPath;
    local_298.g_ = 6.0;
    local_298.b_ = 0.0;
    local_288.r_ = local_278 + -10.0;
    local_1d8._0_4_ = local_288.r_;
    local_288.g_ = 6.0;
    local_288.b_ = 0.0;
    local_228 = OpenSteer::drawGetWindowWidth();
    fVar19 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine
              ((Vec3 *)&local_298,(Vec3 *)&local_288,(Color *)OpenSteer::gRed,local_228,fVar19);
    local_298.r_ = (float)local_218._0_4_ * local_268 + 10.0;
    local_298.g_ = 3.0;
    local_298.b_ = 0.0;
    local_288.r_ = (float)local_1d8._0_4_;
    local_288.g_ = 4.0;
    local_288.b_ = 0.0;
    local_228 = OpenSteer::drawGetWindowWidth();
    fVar19 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine
              ((Vec3 *)&local_298,(Vec3 *)&local_288,(Color *)OpenSteer::gGreen,local_228,fVar19);
  }
  local_298.r_ = 10.0;
  local_298.g_ = 5.0;
  local_288.r_ = local_268 * ((float)local_1f8._0_4_ / local_24c) + 10.0;
  local_298.b_ = 0.0;
  local_288.g_ = 5.0;
  local_288.b_ = 0.0;
  local_268 = OpenSteer::drawGetWindowWidth();
  fVar19 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_298,(Vec3 *)&local_288,(Color *)OpenSteer::gWhite,local_268,fVar19);
  local_298.r_ = 10.0;
  local_298.g_ = 5.0;
  local_298.b_ = 0.0;
  local_288.r_ = 10.0;
  local_288.g_ = 3.0;
  local_288.b_ = 0.0;
  local_268 = OpenSteer::drawGetWindowWidth();
  fVar19 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_298,(Vec3 *)&local_288,(Color *)OpenSteer::gWhite,local_268,fVar19);
  local_298.r_ = local_278 + -10.0;
  local_298.g_ = 5.0;
  local_298.b_ = 0.0;
  local_288.g_ = 3.0;
  local_288.b_ = 0.0;
  local_288.r_ = local_298.r_;
  local_278 = OpenSteer::drawGetWindowWidth();
  fVar19 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_298,(Vec3 *)&local_288,(Color *)OpenSteer::gWhite,local_278,fVar19);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
        {
            // update camera, tracking test vehicle
            OpenSteerDemo::updateCamera (currentTime, elapsedTime, vehicle);

            // draw "ground plane"  (make it 4x map size)
            const float s = MapDriver::worldSize * 2;
            const float u = -0.2f;
            drawQuadrangle (Vec3 (+s, u, +s),
                            Vec3 (+s, u, -s),
                            Vec3 (-s, u, -s),
                            Vec3 (-s, u, +s),
                            Color (0.8f, 0.7f, 0.5f)); // "sand"

            // draw map and path
            vehicle->drawMap ();
            if (vehicle->demoSelect == 2) vehicle->drawPath ();

            // draw test vehicle
            vehicle->draw ();

            // QQQ mark origin to help spot artifacts
            const float tick = 2;
            drawLine (Vec3 (tick, 0, 0), Vec3 (-tick, 0, 0), gGreen);
            drawLine (Vec3 (0, 0, tick), Vec3 (0, 0, -tick), gGreen);

            // compute conversion factor miles-per-hour to meters-per-second
            const float metersPerMile = 1609.344f;
            const float secondsPerHour = 3600;
            const float MPSperMPH = metersPerMile / secondsPerHour;

            // display status in the upper left corner of the window
            std::ostringstream status;
            status << "Speed: "
                   << (int) vehicle->speed () << " mps ("
                   << (int) (vehicle->speed () / MPSperMPH) << " mph)"
                   << ", average: "
                   << std::setprecision (1) << std::setiosflags (std::ios::fixed)
                   << vehicle->totalDistance / vehicle->totalTime

                   << " mps\n\n";
            status << "collisions avoided for "
                   << (int)(OpenSteerDemo::clock.getTotalSimulationTime () -
                            vehicle->timeOfLastCollision)
                   << " seconds";
            if (vehicle->countOfCollisionFreeTimes > 0)
            {
                status << "\nmean time between collisions: "
                       << (int) (vehicle->sumOfCollisionFreeTimes /
                                 vehicle->countOfCollisionFreeTimes)
                       << " ("
                       << (int)vehicle->sumOfCollisionFreeTimes
                       << "/"
                       << (int)vehicle->countOfCollisionFreeTimes
                       << ")";
            }

            status << "\n\nStuck count: " << vehicle->stuckCount << " (" 
                   << vehicle->stuckCycleCount << " cycles, "
                   << vehicle->stuckOffPathCount << " off path)";
            status << "\n\n[F1] ";
            if (1 == vehicle->demoSelect) status << "wander, ";
            if (2 == vehicle->demoSelect) status << "follow path, ";
            status << "avoid obstacle";

            if (2 == vehicle->demoSelect)
            {
                status << "\n[F2] path following direction: ";
                if (vehicle->pathFollowDirection>0)status<<"+1";else status<<"-1";
                status << "\n[F3] path fence: ";
                if (usePathFences) status << "on"; else status << "off";
            }

            status << "\n[F4] rocks: ";
            if (useRandomRocks) status << "on"; else status << "off";
            status << "\n[F5] prediction: ";
            if (vehicle->curvedSteering)
                status << "curved"; else status << "linear";
            if (2 == vehicle->demoSelect)
            {
                status << "\n\nLap " << vehicle->lapsStarted
                       << " (completed: "
                       << ((vehicle->lapsStarted < 2) ? 0 :
                           (int) (100 * ((float) vehicle->lapsFinished /
                                         (float) (vehicle->lapsStarted - 1))))
                       << "%)";

                status << "\nHints given: " << vehicle->hintGivenCount
                       << ", taken: " << vehicle->hintTakenCount;
            }
            status << "\n";
            qqqRange ("WR ", vehicle->savedNearestWR, status);
            qqqRange ("R  ", vehicle->savedNearestR,  status);
            qqqRange ("L  ", vehicle->savedNearestL,  status);
            qqqRange ("WL ", vehicle->savedNearestWL, status);
            status << std::ends;
            const float h = drawGetWindowHeight ();
            const Vec3 screenLocation (10, h-50, 0);
            const Color color (0.15f, 0.15f, 0.5f);
            draw2dTextAt2dLocation (status, screenLocation, color, drawGetWindowWidth(), drawGetWindowHeight());

            {
                const float v = 5;
                const float m = 10;
                const float w = drawGetWindowWidth ();
                const float f = w - (2 * m);
                const float s = vehicle->relativeSpeed ();

                // limit tick mark
                const float l = vehicle->annoteMaxRelSpeed;
                draw2dLine (Vec3 (m+(f*l), v-3, 0), Vec3 (m+(f*l),v+3, 0), gBlack, drawGetWindowWidth(), drawGetWindowHeight());
                // two "inverse speedometers" showing limits due to curvature and
                // path alignment
                if (l!=0)
                {
                    const float c = vehicle->annoteMaxRelSpeedCurve;
                    const float p = vehicle->annoteMaxRelSpeedPath;
                    draw2dLine (Vec3(m+(f*c), v+1, 0), Vec3(w-m, v+1, 0), gRed, drawGetWindowWidth(), drawGetWindowHeight());
                    draw2dLine (Vec3(m+(f*p), v-2, 0), Vec3(w-m, v-1, 0), gGreen, drawGetWindowWidth(), drawGetWindowHeight());
                }
                // speedometer: horizontal line with length proportional to speed
                draw2dLine (Vec3 (m, v, 0), Vec3 (m + (f * s), v, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                // min and max tick marks
                draw2dLine (Vec3 (m,       v, 0), Vec3 (m,      v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                draw2dLine (Vec3 (w-m,     v, 0), Vec3 (w-m,    v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
            }
        }